

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericBlendersTests.cpp
# Opt level: O2

void __thiscall
agge::tests::GenericRGBXBlenderTests::BlendingWhiteOnBlackProducesGrayDependingOnCover
          (GenericRGBXBlenderTests *this)

{
  color cVar1;
  long lVar2;
  uint8_t covers [7];
  allocator local_a1;
  blender_solid_color_rgb<agge::tests::mocks::pixel_rgbx<agge::order_rgba>,_agge::order_rgba>
  whiteness;
  pixel dest [7];
  pixel reference [7];
  LocationInfo local_58;
  string local_30;
  
  covers[4] = 0x81;
  covers[5] = 0xf0;
  covers[6] = 0xff;
  covers[0] = '\0';
  covers[1] = '\x12';
  covers[2] = '!';
  covers[3] = 'q';
  cVar1 = color::make(0xff,0xff,0xff,0xff);
  whiteness._color._0_2_ = cVar1._0_2_;
  whiteness._color.b = cVar1.b;
  whiteness._color.a = cVar1.a;
  whiteness._a = (((uint)cVar1 >> 0x18) * 0x1f9) / 1000 + ((uint)cVar1 >> 0x18) * 0x40;
  for (lVar2 = 0; lVar2 != 0x1c; lVar2 = lVar2 + 4) {
    *(undefined4 *)(dest[0].components + lVar2) = 0;
  }
  blender_solid_color_rgb<agge::tests::mocks::pixel_rgbx<agge::order_rgba>,_agge::order_rgba>::
  operator()(&whiteness,dest,0,0,1,covers);
  blender_solid_color_rgb<agge::tests::mocks::pixel_rgbx<agge::order_rgba>,_agge::order_rgba>::
  operator()(&whiteness,dest + 1,0,0,1,covers + 1);
  blender_solid_color_rgb<agge::tests::mocks::pixel_rgbx<agge::order_rgba>,_agge::order_rgba>::
  operator()(&whiteness,dest + 2,0,0,1,covers + 2);
  blender_solid_color_rgb<agge::tests::mocks::pixel_rgbx<agge::order_rgba>,_agge::order_rgba>::
  operator()(&whiteness,dest + 3,0,0,1,covers + 3);
  blender_solid_color_rgb<agge::tests::mocks::pixel_rgbx<agge::order_rgba>,_agge::order_rgba>::
  operator()(&whiteness,dest + 4,0,0,1,covers + 4);
  blender_solid_color_rgb<agge::tests::mocks::pixel_rgbx<agge::order_rgba>,_agge::order_rgba>::
  operator()(&whiteness,dest + 5,0,0,1,covers + 5);
  blender_solid_color_rgb<agge::tests::mocks::pixel_rgbx<agge::order_rgba>,_agge::order_rgba>::
  operator()(&whiteness,dest + 6,0,0,1,covers + 6);
  reference[4].components[0] = 0x80;
  reference[4].components[1] = 0x80;
  reference[4].components[2] = 0x80;
  reference[4].components[3] = 0x80;
  reference[5].components[0] = 0xef;
  reference[5].components[1] = 0xef;
  reference[5].components[2] = 0xef;
  reference[5].components[3] = 0xef;
  reference[6].components[0] = 0xff;
  reference[6].components[1] = 0xff;
  reference[6].components[2] = 0xff;
  reference[6].components[3] = 0xff;
  reference[0].components[0] = '\0';
  reference[0].components[1] = '\0';
  reference[0].components[2] = '\0';
  reference[0].components[3] = '\0';
  builtin_memcpy(reference[1].components,"\x11\x11\x11\x11",4);
  builtin_memcpy(reference[2].components,"    ",4);
  builtin_memcpy(reference[3].components,"pppp",4);
  std::__cxx11::string::string
            ((string *)&local_30,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/GenericBlendersTests.cpp"
             ,&local_a1);
  ut::LocationInfo::LocationInfo(&local_58,&local_30,0x3e);
  ut::
  are_equal<agge::tests::mocks::pixel_rgbx<agge::order_rgba>,agge::tests::mocks::pixel_rgbx<agge::order_rgba>,7ul>
            (&reference,&dest,&local_58);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

test( BlendingWhiteOnBlackProducesGrayDependingOnCover )
			{
				typedef mocks::pixel_rgbx<order_rgba> pixel;

				// INIT
				const int n = 7;
				const pixel black = { };
				const uint8_t covers[n] = { 0x00, 0x12, 0x21, 0x71, 0x81, 0xF0, 0xFF };
				blender_solid_color_rgb<pixel, order_rgba> whiteness(color::make(0xFF, 0xFF, 0xFF));
				pixel dest[n];

				fill_n(dest, n, black);

				// ACT
				whiteness(dest + 0, 0, 0, 1, covers + 0);
				whiteness(dest + 1, 0, 0, 1, covers + 1);
				whiteness(dest + 2, 0, 0, 1, covers + 2);
				whiteness(dest + 3, 0, 0, 1, covers + 3);
				whiteness(dest + 4, 0, 0, 1, covers + 4);
				whiteness(dest + 5, 0, 0, 1, covers + 5);
				whiteness(dest + 6, 0, 0, 1, covers + 6);

				// ASSERT
				pixel reference[] = {
					{ { 0x00, 0x00, 0x00, 0x00 } },
					{ { 0x11, 0x11, 0x11, 0x11 } },
					{ { 0x20, 0x20, 0x20, 0x20 } },
					{ { 0x70, 0x70, 0x70, 0x70 } },
					{ { 0x80, 0x80, 0x80, 0x80 } },
					{ { 0xEF, 0xEF, 0xEF, 0xEF } },
					{ { 0xFF, 0xFF, 0xFF, 0xFF } },
				};

				assert_equal(reference, dest);
			}